

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O1

void __thiscall FTextureManager::LoadTextureDefs(FTextureManager *this,int wadnum,char *lumpname)

{
  BYTE BVar1;
  TextureHash *pTVar2;
  int fitheight;
  bool bVar3;
  int iVar4;
  int iVar5;
  FTextureID picnum;
  FTexture *pFVar6;
  FTexture *this_00;
  byte bVar7;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  char *format;
  BYTE BVar12;
  bool bVar13;
  FString src;
  TArray<FTextureID,_FTextureID> tlist;
  FString base;
  int lastLump;
  FScanner sc;
  FString local_178;
  undefined4 local_16c;
  TArray<FTextureID,_FTextureID> local_168;
  FString local_150;
  int local_148;
  int local_144;
  char *local_140;
  FString local_138;
  FScanner local_130;
  NameManager *pNVar8;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_178.Chars = FString::NullString.Nothing;
  local_168.Array = (FTextureID *)0x0;
  local_168.Most = 0;
  local_168.Count = 0;
  local_144 = 0;
  local_148 = wadnum;
  local_140 = lumpname;
LAB_00639286:
  do {
    pNVar8 = (NameManager *)0x0;
    iVar4 = FWadCollection::FindLump(&Wads,lumpname,&local_144,false);
    if (iVar4 == -1) {
      TArray<FTextureID,_FTextureID>::~TArray(&local_168);
      FString::~FString(&local_178);
      return;
    }
    iVar5 = FWadCollection::GetLumpFile(&Wads,iVar4);
  } while (iVar5 != wadnum);
  FScanner::FScanner(&local_130,iVar4);
LAB_006392c5:
  do {
    bVar3 = FScanner::GetString(&local_130);
    if (!bVar3) break;
    bVar3 = FScanner::Compare(&local_130,"remap");
    if (bVar3) {
      FScanner::MustGetString(&local_130);
      bVar3 = FScanner::Compare(&local_130,"wall");
      local_16c = (undefined4)CONCAT71((int7)((ulong)pNVar8 >> 8),1);
      if (bVar3) {
        BVar12 = '\x01';
LAB_0063954d:
        bVar13 = false;
        bVar3 = false;
      }
      else {
        bVar3 = FScanner::Compare(&local_130,"flat");
        if (bVar3) {
          BVar12 = '\x02';
          goto LAB_0063954d;
        }
        bVar3 = FScanner::Compare(&local_130,"sprite");
        bVar13 = !bVar3;
        BVar12 = bVar3 * '\x03';
        local_16c = 0;
      }
      if (!bVar13) {
        FScanner::MustGetString(&local_130);
      }
      local_130.String[8] = '\0';
      if (local_168.Count != 0) {
        local_168._8_8_ = local_168._8_8_ & 0xffffffff;
      }
      ListTextures(this,local_130.String,&local_168);
      iVar4 = FName::NameManager::FindName(&FName::NameData,local_130.String,false);
      FScanner::MustGetString(&local_130);
      pNVar8 = (NameManager *)0x0;
      iVar5 = FWadCollection::CheckNumForFullName(&Wads,local_130.String,true,0xe);
      if (iVar5 == -1) {
        pNVar8 = (NameManager *)0x0;
        iVar5 = FWadCollection::CheckNumForFullName(&Wads,local_130.String,true,0xf);
      }
      if (local_168.Count == 0) {
        format = "Attempting to remap non-existent texture %s to %s\n";
      }
      else {
        if (iVar5 != -1) {
          if (local_168.Count != 0) {
            uVar10 = 0;
            do {
              pTVar2 = (this->Textures).Array;
              pFVar6 = pTVar2[local_168.Array[uVar10].texnum].Texture;
              BVar1 = pFVar6->UseType;
              bVar7 = BVar1 == '\n' & (byte)local_16c;
              pNVar8 = (NameManager *)CONCAT71((int7)((ulong)pTVar2 >> 8),bVar7);
              if ((((BVar12 == BVar1 || bVar13) || bVar7 != 0) ||
                  (((BVar1 == '\b' && bVar3 == true &&
                    (iVar4 = (*pFVar6->_vptr_FTexture[6])(pFVar6), -1 < iVar4)) &&
                   (iVar4 = FWadCollection::GetLumpNamespace(&Wads,iVar4), iVar4 == 1)))) &&
                 (this_00 = FTexture::CreateTexture(iVar5,0), this_00 != (FTexture *)0x0)) {
                this_00->field_0x31 = this_00->field_0x31 | 4;
                uVar11 = (uint)((double)((uint)pFVar6->Width * 2) / (pFVar6->Scale).X);
                uVar9 = (uint)((double)((uint)pFVar6->Height * 2) / (pFVar6->Scale).Y);
                FTexture::SetScaledSize
                          (this_00,(uVar11 & 1) + ((int)uVar11 >> 1),(uVar9 & 1) + ((int)uVar9 >> 1)
                          );
                uVar9 = (uint)((double)(pFVar6->LeftOffset * 2) / (pFVar6->Scale).X);
                this_00->LeftOffset =
                     (SWORD)(int)((double)(int)((uVar9 & 1) + ((int)uVar9 >> 1)) *
                                 (this_00->Scale).X);
                uVar9 = (uint)((double)(pFVar6->TopOffset * 2) / (pFVar6->Scale).Y);
                this_00->TopOffset =
                     (SWORD)(int)((double)(int)((uVar9 & 1) + ((int)uVar9 >> 1)) *
                                 (this_00->Scale).Y);
                pNVar8 = (NameManager *)0x0;
                ReplaceTexture(this,(FTextureID)local_168.Array[uVar10].texnum,this_00,true);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 < (ulong)local_168._8_8_ >> 0x20);
          }
          goto LAB_006392c5;
        }
        format = "Attempting to remap texture %s to non-existent lump %s\n";
      }
      pNVar8 = &FName::NameData;
      Printf(format,FName::NameData.NameArray[iVar4].Text,local_130.String);
      goto LAB_006392c5;
    }
    bVar3 = FScanner::Compare(&local_130,"define");
    if (bVar3) {
      FScanner::GetString(&local_130);
      ExtractFileBase((char *)&local_150,SUB81(local_130.String,0));
      if (*(int *)(local_150.Chars + -0xc) != 0) {
        FString::Left(&local_138,(size_t)&local_150);
        FString::operator=(&local_178,&local_138);
        FString::~FString(&local_138);
        pNVar8 = (NameManager *)0x0;
        iVar4 = FWadCollection::CheckNumForFullName(&Wads,local_130.String,true,0xe);
        if (iVar4 == -1) {
          pNVar8 = (NameManager *)0x0;
          iVar4 = FWadCollection::CheckNumForFullName(&Wads,local_130.String,true,0xf);
        }
        FScanner::GetString(&local_130);
        bVar3 = FScanner::Compare(&local_130,"force32bit");
        if (!bVar3) {
          FScanner::UnGet(&local_130);
        }
        FScanner::GetNumber(&local_130);
        iVar5 = local_130.Number;
        FScanner::GetNumber(&local_130);
        fitheight = local_130.Number;
        if ((-1 < iVar4) && (pFVar6 = FTexture::CreateTexture(iVar4,10), pFVar6 != (FTexture *)0x0))
        {
          pFVar6->field_0x31 = pFVar6->field_0x31 | 4;
          FTexture::SetScaledSize(pFVar6,iVar5,fitheight);
          FString::operator=(&pFVar6->Name,&local_178);
          pNVar8 = (NameManager *)0x0;
          picnum = CheckForTexture(&TexMan,local_178.Chars,8,1);
          if (picnum.texnum < 1) {
            AddTexture(this,pFVar6);
          }
          else {
            pNVar8 = (NameManager *)0x0;
            ReplaceTexture(this,picnum,pFVar6,true);
            pFVar6->UseType = '\n';
          }
        }
      }
      FString::~FString(&local_150);
      goto LAB_006392c5;
    }
    bVar3 = FScanner::Compare(&local_130,"texture");
    iVar4 = 10;
    if (!bVar3) {
      bVar3 = FScanner::Compare(&local_130,"sprite");
      iVar4 = 3;
      if (!bVar3) {
        bVar3 = FScanner::Compare(&local_130,"walltexture");
        iVar4 = 1;
        if (!bVar3) {
          bVar3 = FScanner::Compare(&local_130,"flat");
          iVar4 = 2;
          if (!bVar3) {
            bVar3 = FScanner::Compare(&local_130,"graphic");
            iVar4 = 8;
            if (!bVar3) {
              FScanner::ScriptError
                        (&local_130,"Texture definition expected, found \'%s\'",local_130.String);
              goto LAB_006392c5;
            }
          }
        }
      }
    }
    ParseXTexture(this,&local_130,iVar4);
  } while( true );
  FScanner::~FScanner(&local_130);
  lumpname = local_140;
  wadnum = local_148;
  goto LAB_00639286;
}

Assistant:

void FTextureManager::LoadTextureDefs(int wadnum, const char *lumpname)
{
	int remapLump, lastLump;
	FString src;
	bool is32bit;
	int width, height;
	int type, mode;
	TArray<FTextureID> tlist;

	lastLump = 0;

	while ((remapLump = Wads.FindLump(lumpname, &lastLump)) != -1)
	{
		if (Wads.GetLumpFile(remapLump) == wadnum)
		{
			FScanner sc(remapLump);
			while (sc.GetString())
			{
				if (sc.Compare("remap")) // remap an existing texture
				{
					sc.MustGetString();

					// allow selection by type
					if (sc.Compare("wall")) type=FTexture::TEX_Wall, mode=FTextureManager::TEXMAN_Overridable;
					else if (sc.Compare("flat")) type=FTexture::TEX_Flat, mode=FTextureManager::TEXMAN_Overridable;
					else if (sc.Compare("sprite")) type=FTexture::TEX_Sprite, mode=0;
					else type = FTexture::TEX_Any, mode = 0;

					if (type != FTexture::TEX_Any) sc.MustGetString();

					sc.String[8]=0;

					tlist.Clear();
					int amount = ListTextures(sc.String, tlist);
					FName texname = sc.String;

					sc.MustGetString();
					int lumpnum = Wads.CheckNumForFullName(sc.String, true, ns_patches);
					if (lumpnum == -1) lumpnum = Wads.CheckNumForFullName(sc.String, true, ns_graphics);

					if (tlist.Size() == 0)
					{
						Printf("Attempting to remap non-existent texture %s to %s\n",
							texname.GetChars(), sc.String);
					}
					else if (lumpnum == -1)
					{
						Printf("Attempting to remap texture %s to non-existent lump %s\n",
							texname.GetChars(), sc.String);
					}
					else
					{
						for(unsigned int i = 0; i < tlist.Size(); i++)
						{
							FTexture * oldtex = Textures[tlist[i].GetIndex()].Texture;
							int sl;

							// only replace matching types. For sprites also replace any MiscPatches
							// based on the same lump. These can be created for icons.
							if (oldtex->UseType == type || type == FTexture::TEX_Any ||
								(mode == TEXMAN_Overridable && oldtex->UseType == FTexture::TEX_Override) ||
								(type == FTexture::TEX_Sprite && oldtex->UseType == FTexture::TEX_MiscPatch &&
								(sl=oldtex->GetSourceLump()) >= 0 && Wads.GetLumpNamespace(sl) == ns_sprites)
								)
							{
								FTexture * newtex = FTexture::CreateTexture (lumpnum, FTexture::TEX_Any);
								if (newtex != NULL)
								{
									// Replace the entire texture and adjust the scaling and offset factors.
									newtex->bWorldPanning = true;
									newtex->SetScaledSize(oldtex->GetScaledWidth(), oldtex->GetScaledHeight());
									newtex->LeftOffset = int(oldtex->GetScaledLeftOffset() * newtex->Scale.X);
									newtex->TopOffset = int(oldtex->GetScaledTopOffset() * newtex->Scale.Y);
									ReplaceTexture(tlist[i], newtex, true);
								}
							}
						}
					}
				}
				else if (sc.Compare("define")) // define a new "fake" texture
				{
					sc.GetString();
					
					FString base = ExtractFileBase(sc.String, false);
					if (!base.IsEmpty())
					{
						src = base.Left(8);

						int lumpnum = Wads.CheckNumForFullName(sc.String, true, ns_patches);
						if (lumpnum == -1) lumpnum = Wads.CheckNumForFullName(sc.String, true, ns_graphics);

						sc.GetString();
						is32bit = !!sc.Compare("force32bit");
						if (!is32bit) sc.UnGet();

						sc.GetNumber();
						width = sc.Number;
						sc.GetNumber();
						height = sc.Number;

						if (lumpnum>=0)
						{
							FTexture *newtex = FTexture::CreateTexture(lumpnum, FTexture::TEX_Override);

							if (newtex != NULL)
							{
								// Replace the entire texture and adjust the scaling and offset factors.
								newtex->bWorldPanning = true;
								newtex->SetScaledSize(width, height);
								newtex->Name = src;

								FTextureID oldtex = TexMan.CheckForTexture(src, FTexture::TEX_MiscPatch);
								if (oldtex.isValid()) 
								{
									ReplaceTexture(oldtex, newtex, true);
									newtex->UseType = FTexture::TEX_Override;
								}
								else AddTexture(newtex);
							}
						}
					}				
					//else Printf("Unable to define hires texture '%s'\n", tex->Name);
				}
				else if (sc.Compare("texture"))
				{
					ParseXTexture(sc, FTexture::TEX_Override);
				}
				else if (sc.Compare("sprite"))
				{
					ParseXTexture(sc, FTexture::TEX_Sprite);
				}
				else if (sc.Compare("walltexture"))
				{
					ParseXTexture(sc, FTexture::TEX_Wall);
				}
				else if (sc.Compare("flat"))
				{
					ParseXTexture(sc, FTexture::TEX_Flat);
				}
				else if (sc.Compare("graphic"))
				{
					ParseXTexture(sc, FTexture::TEX_MiscPatch);
				}
				else
				{
					sc.ScriptError("Texture definition expected, found '%s'", sc.String);
				}
			}
		}
	}
}